

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>::
operator()(LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ulong uVar1;
  ulong uVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<unsigned_long_long> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  int iVar13;
  ImDrawIdx IVar14;
  long lVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pGVar7 = this->Getter;
  iVar13 = pGVar7->Count;
  lVar15 = (long)(((pGVar7->Offset + prim + 1) % iVar13 + iVar13) % iVar13) * (long)pGVar7->Stride;
  iVar13 = this->Transformer->YAxis;
  uVar1 = *(ulong *)((long)pGVar7->Ys + lVar15);
  uVar2 = *(ulong *)((long)pGVar7->Xs + lVar15);
  IVar3 = GImPlot->PixelRange[iVar13].Min;
  IVar16.x = (float)(GImPlot->Mx *
                     ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar2 & 0xffffffff | 0x4330000000000000)) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x);
  IVar16.y = (float)(GImPlot->My[iVar13] *
                     ((((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar1 & 0xffffffff | 0x4330000000000000)) -
                     GImPlot->CurrentPlot->YAxis[iVar13].Range.Min) + (double)IVar3.y);
  fVar17 = (this->P1).x;
  fVar18 = (this->P1).y;
  auVar22._0_4_ = ~-(uint)(IVar16.x <= fVar17) & (uint)IVar16.x;
  auVar22._4_4_ = ~-(uint)(IVar16.y <= fVar18) & (uint)IVar16.y;
  auVar22._8_4_ = ~-(uint)(fVar17 < IVar16.x) & (uint)IVar16.x;
  auVar22._12_4_ = ~-(uint)(fVar18 < IVar16.y) & (uint)IVar16.y;
  auVar11._4_4_ = (uint)fVar18 & -(uint)(IVar16.y <= fVar18);
  auVar11._0_4_ = (uint)fVar17 & -(uint)(IVar16.x <= fVar17);
  auVar11._8_4_ = (uint)fVar17 & -(uint)(fVar17 < IVar16.x);
  auVar11._12_4_ = (uint)fVar18 & -(uint)(fVar18 < IVar16.y);
  auVar22 = auVar22 | auVar11;
  fVar19 = (cull_rect->Min).y;
  auVar12._4_8_ = auVar22._8_8_;
  auVar12._0_4_ = -(uint)(auVar22._4_4_ < fVar19);
  auVar23._0_8_ = auVar12._0_8_ << 0x20;
  auVar23._8_4_ = -(uint)(auVar22._8_4_ < (cull_rect->Max).x);
  auVar23._12_4_ = -(uint)(auVar22._12_4_ < (cull_rect->Max).y);
  auVar24._4_4_ = -(uint)(fVar19 < auVar22._4_4_);
  auVar24._0_4_ = -(uint)((cull_rect->Min).x < auVar22._0_4_);
  auVar24._8_8_ = auVar23._8_8_;
  iVar13 = movmskps((int)GImPlot,auVar24);
  if (iVar13 == 0xf) {
    IVar5 = this->Col;
    IVar3 = *uv;
    fVar19 = IVar16.x - fVar17;
    fVar20 = IVar16.y - fVar18;
    fVar21 = fVar19 * fVar19 + fVar20 * fVar20;
    if (0.0 < fVar21) {
      fVar21 = 1.0 / SQRT(fVar21);
      fVar19 = fVar19 * fVar21;
      fVar20 = fVar20 * fVar21;
    }
    fVar21 = this->Weight * 0.5;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar5;
    fVar19 = fVar21 * fVar19;
    fVar21 = fVar21 * fVar20;
    (pIVar8->pos).x = fVar17 + fVar21;
    (pIVar8->pos).y = fVar18 - fVar19;
    pIVar9[1].pos.x = fVar21 + IVar16.x;
    pIVar9[1].pos.y = IVar16.y - fVar19;
    pIVar9[1].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar5;
    pIVar8[2].pos.x = IVar16.x - fVar21;
    pIVar8[2].pos.y = fVar19 + IVar16.y;
    pIVar8[2].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar5;
    IVar4 = this->P1;
    pIVar8[3].pos.x = IVar4.x - fVar21;
    pIVar8[3].pos.y = IVar4.y + fVar19;
    pIVar8[3].uv.x = IVar3.x;
    pIVar8[3].uv.y = IVar3.y;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar6;
    *pIVar10 = IVar14;
    pIVar10[1] = IVar14 + 1;
    pIVar10[2] = IVar14 + 2;
    pIVar10[3] = IVar14;
    pIVar10[4] = IVar14 + 2;
    pIVar10[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  this->P1 = IVar16;
  return (char)iVar13 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }